

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgToken.cpp
# Opt level: O0

Token * __thiscall rsg::Token::operator=(Token *this,Token *other)

{
  char *pcVar1;
  bad_alloc *this_00;
  Token *other_local;
  Token *this_local;
  
  if (this->m_type == IDENTIFIER) {
    deFree((this->m_arg).identifier);
    (this->m_arg).identifier = (char *)0x0;
  }
  this->m_type = other->m_type;
  if (this->m_type == IDENTIFIER) {
    pcVar1 = deStrdup((other->m_arg).identifier);
    (this->m_arg).identifier = pcVar1;
    if ((this->m_arg).identifier == (char *)0x0) {
      this_00 = (bad_alloc *)__cxa_allocate_exception(8);
      std::bad_alloc::bad_alloc(this_00);
      __cxa_throw(this_00,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
  }
  else if (this->m_type == FLOAT_LITERAL) {
    (this->m_arg).floatValue = (other->m_arg).floatValue;
  }
  else if (this->m_type == INT_LITERAL) {
    (this->m_arg).floatValue = (other->m_arg).floatValue;
  }
  else if (this->m_type == BOOL_LITERAL) {
    (this->m_arg).boolValue = (bool)((other->m_arg).boolValue & 1);
  }
  return this;
}

Assistant:

Token& Token::operator= (const Token& other)
{
	if (m_type == IDENTIFIER)
	{
		deFree(m_arg.identifier);
		m_arg.identifier = DE_NULL;
	}

	m_type = other.m_type;

	if (m_type == IDENTIFIER)
	{
		m_arg.identifier = deStrdup(other.m_arg.identifier);
		if (!m_arg.identifier)
			throw std::bad_alloc();
	}
	else if (m_type == FLOAT_LITERAL)
		m_arg.floatValue = other.m_arg.floatValue;
	else if (m_type == INT_LITERAL)
		m_arg.intValue = other.m_arg.intValue;
	else if (m_type == BOOL_LITERAL)
		m_arg.boolValue = other.m_arg.boolValue;

	return *this;
}